

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi_baseline_index_impl.h
# Opt level: O1

void __thiscall
json::JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_two(JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
         *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *cost_matrix,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *mask_matrix,unsigned_long *matrix_size,vector<double,_std::allocator<double>_> *row_cover,
        vector<double,_std::allocator<double>_> *col_cover,int *step)

{
  double dVar1;
  unsigned_long uVar2;
  pointer pvVar3;
  long lVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  unsigned_long uVar8;
  unsigned_long c;
  unsigned_long uVar9;
  
  uVar2 = *matrix_size;
  if (uVar2 != 0) {
    pvVar3 = (cost_matrix->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar4 = *(long *)&pvVar3[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      pdVar5 = (row_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar7 = (mask_matrix->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        dVar1 = *(double *)(lVar4 + uVar9 * 8);
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar1 = pdVar5[uVar8], dVar1 == 0.0)) &&
           (((!NAN(dVar1) && (dVar1 = pdVar6[uVar9], dVar1 == 0.0)) && (!NAN(dVar1))))) {
          *(undefined8 *)
           (*(long *)&pvVar7[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar9 * 8) = 0x3ff0000000000000;
          pdVar5[uVar8] = 1.0;
          pdVar6[uVar9] = 1.0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
    memset((row_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,0,uVar2 << 3);
    memset((col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,0,uVar2 << 3);
  }
  *step = 3;
  return;
}

Assistant:

void JEDIBaselineTreeIndex<cost_matrixModel, TreeIndex>::step_two(
    std::vector<std::vector<double> >& cost_matrix,
    std::vector<std::vector<double> >& mask_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    int& step)
{
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] == 0 && row_cover[r] == 0 && col_cover[c] == 0)
      {
        mask_matrix[r][c] = 1;
        row_cover[r] = 1;
        col_cover[c] = 1;
      }
    }
  }
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    row_cover[r] = 0;
  }
  for (unsigned long c = 0; c < matrix_size; c++)
  {
    col_cover[c] = 0;
  }
  step = 3;
}